

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O2

CURLcode gopher_do(Curl_easy *data,_Bool *done)

{
  curl_socket_t writefd;
  char *pcVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  timediff_t timeout_ms;
  char *sel;
  size_t amount;
  char *local_40;
  size_t len;
  
  writefd = data->conn->sock[0];
  pcVar4 = (data->state).up.path;
  pcVar1 = (data->state).up.query;
  sel = (char *)0x0;
  *done = true;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = (*Curl_cstrdup)(pcVar4);
  }
  else {
    pcVar4 = curl_maprintf("%s?%s");
  }
  if (pcVar4 == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar5 = strlen(pcVar4);
    if (sVar5 < 3) {
      sel = "";
      len = 0;
      (*Curl_cfree)(pcVar4);
      local_40 = (char *)0x0;
      sVar6 = 0;
    }
    else {
      CVar2 = Curl_urldecode(pcVar4 + 2,0,&sel,&len,REJECT_ZERO);
      (*Curl_cfree)(pcVar4);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      local_40 = sel;
      sVar6 = len;
    }
    sVar6 = curlx_uztosz(sVar6);
    do {
      CVar2 = CURLE_OK;
      if (((*sel == '\0') ||
          (CVar2 = Curl_xfer_send(data,sel,sVar6,false,&amount), CVar2 != CURLE_OK)) ||
         (CVar2 = Curl_client_write(data,4,sel,amount), CVar2 != CURLE_OK)) goto LAB_0012ebd8;
      sVar6 = sVar6 - amount;
      sel = sel + amount;
      CVar2 = CURLE_OK;
      if ((long)sVar6 < 1) goto LAB_0012ebd8;
      timeout_ms = Curl_timeleft(data,(curltime *)0x0,false);
      if (timeout_ms < 0) break;
      if (timeout_ms == 0) {
        timeout_ms = 0x7fffffffffffffff;
      }
      iVar3 = Curl_socket_check(-1,-1,writefd,timeout_ms);
      if (iVar3 < 0) {
        CVar2 = CURLE_SEND_ERROR;
        goto LAB_0012ebd8;
      }
    } while (iVar3 != 0);
    CVar2 = CURLE_OPERATION_TIMEDOUT;
LAB_0012ebd8:
    (*Curl_cfree)(local_40);
    if ((CVar2 == CURLE_OK) &&
       (CVar2 = Curl_xfer_send(data,"\r\n",2,false,&amount), CVar2 == CURLE_OK)) {
      CVar2 = Curl_client_write(data,4,"\r\n",2);
      if (CVar2 == CURLE_OK) {
        CVar2 = CURLE_OK;
        Curl_xfer_setup1(data,1,-1,false);
      }
    }
    else {
      Curl_failf(data,"Failed sending Gopher request");
    }
  }
  return CVar2;
}

Assistant:

static CURLcode gopher_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  char *gopherpath;
  char *path = data->state.up.path;
  char *query = data->state.up.query;
  char *sel = NULL;
  char *sel_org = NULL;
  timediff_t timeout_ms;
  ssize_t k;
  size_t amount, len;
  int what;

  *done = TRUE; /* unconditionally */

  /* path is guaranteed non-NULL */
  DEBUGASSERT(path);

  if(query)
    gopherpath = aprintf("%s?%s", path, query);
  else
    gopherpath = strdup(path);

  if(!gopherpath)
    return CURLE_OUT_OF_MEMORY;

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(gopherpath) <= 2) {
    sel = (char *)CURL_UNCONST("");
    len = strlen(sel);
    free(gopherpath);
  }
  else {
    char *newp;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = gopherpath;
    newp += 2;

    /* ... and finally unescape */
    result = Curl_urldecode(newp, 0, &sel, &len, REJECT_ZERO);
    free(gopherpath);
    if(result)
      return result;
    sel_org = sel;
  }

  k = curlx_uztosz(len);

  for(;;) {
    /* Break out of the loop if the selector is empty because OpenSSL and/or
       LibreSSL fail with errno 0 if this is the case. */
    if(strlen(sel) < 1)
      break;

    result = Curl_xfer_send(data, sel, k, FALSE, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(data, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    timeout_ms = Curl_timeleft(data, NULL, FALSE);
    if(timeout_ms < 0) {
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
    if(!timeout_ms)
      timeout_ms = TIMEDIFF_T_MAX;

    /* Do not busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that are not
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.
    */
    what = SOCKET_WRITABLE(sockfd, timeout_ms);
    if(what < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
    else if(!what) {
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
  }

  free(sel_org);

  if(!result)
    result = Curl_xfer_send(data, "\r\n", 2, FALSE, &amount);
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(data, CLIENTWRITE_HEADER, "\r\n", 2);
  if(result)
    return result;

  Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
  return CURLE_OK;
}